

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v6::detail::write_exponent<char,char*>(int exp,char *it)

{
  long lVar1;
  char *d;
  char *top;
  char *it_local;
  int exp_local;
  
  if ((-10000 < exp) && (exp < 10000)) {
    if (exp < 0) {
      *it = '-';
      it_local._4_4_ = -exp;
    }
    else {
      *it = '+';
      it_local._4_4_ = exp;
    }
    top = it + 1;
    if (99 < it_local._4_4_) {
      lVar1 = (long)(it_local._4_4_ / 100 << 1);
      if (999 < it_local._4_4_) {
        *top = basic_data<void>::digits[lVar1];
        top = it + 2;
      }
      *top = basic_data<void>::digits[lVar1 + 1];
      it_local._4_4_ = it_local._4_4_ % 100;
      top = top + 1;
    }
    *top = basic_data<void>::digits[it_local._4_4_ << 1];
    top[1] = basic_data<void>::digits[(long)(it_local._4_4_ << 1) + 1];
    return top + 2;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/fmt/include/fmt/format.h"
              ,0x426,"exponent out of range");
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}